

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O0

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapePrism>::TPZCompElKernelHDiv3D
          (TPZCompElKernelHDiv3D<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  HCurlFamily in_ECX;
  TPZGeoEl *in_RDX;
  TPZCompMesh *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZCompElHCurl<pzshape::TPZShapePrism> *unaff_retaddr;
  int firstside;
  TPZRegisterClassId *vtt;
  
  vtt = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElKernelHDiv3D<pzshape::TPZShapePrism>>(in_RDI,0x21)
  ;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02522050);
  TPZCompElHCurl<pzshape::TPZShapePrism>::TPZCompElHCurl
            (unaff_retaddr,(void **)vtt,in_RSI,in_RDX,in_ECX);
  *(undefined ***)in_RDI = &PTR__TPZCompElKernelHDiv3D_02521c28;
  *(undefined ***)in_RDI = &PTR__TPZCompElKernelHDiv3D_02521c28;
  *(HCurlFamily *)(in_RDI + 0x10c) = in_ECX;
  return;
}

Assistant:

TPZCompElKernelHDiv3D<TSHAPE>::TPZCompElKernelHDiv3D(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElKernelHDiv3D::ClassId), TPZCompElHCurl<TSHAPE>(mesh,gel,HCurlFamily::EHCurlNoGrads),
                  fhdivfam(hdivfam) {
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    
    //Updates the number of shape functions and also the integration rule
    if (TSHAPE::Type() == ETetraedro || TSHAPE::Type() == ETriangle){
        for (int icon = 0; icon < this->NConnects(); icon++)
        {
            TPZConnect &c = this->Connect(icon);
            int nShapeF = NConnectShapeF(icon,c.Order());
            c.SetNShape(nShapeF);
            int64_t seqnum = c.SequenceNumber();
            int nvar = 1;
            TPZMaterial * mat = this->Material();
            if (mat) nvar = mat->NStateVariables();
            this->Mesh()->Block().Set(seqnum, nvar * nShapeF);
            this->AdjustIntegrationRule();
        }
    }
}